

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O2

void nak(int error)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  size_t __n;
  int *piVar3;
  
  buf.hdr.th_opcode = 0x500;
  buf._2_2_ = (ushort)error << 8 | (ushort)error >> 8;
  piVar3 = &formata[2].f_convert;
  do {
    iVar1 = piVar3[2];
    piVar3 = piVar3 + 4;
    if (iVar1 < 0) break;
  } while (iVar1 != error);
  if (iVar1 < 0) {
    __s = strerror(error + -100);
    *(char **)piVar3 = __s;
    buf._2_2_ = 0;
  }
  else {
    __s = *(char **)piVar3;
  }
  sVar2 = strlen(__s);
  memcpy((void *)((long)&buf.hdr.th_u1 + 2),__s,(long)((sVar2 << 0x20) + 0x100000000) >> 0x20);
  __n = (long)((sVar2 << 0x20) + 0x500000000) >> 0x20;
  sVar2 = send(peer,&buf,__n,0x4000);
  if (sVar2 == __n) {
    return;
  }
  logmsg("nak: fail\n");
  return;
}

Assistant:

static void nak(int error)
{
  struct tftphdr *tp;
  int length;
  struct errmsg *pe;

  tp = &buf.hdr;
  tp->th_opcode = htons((unsigned short)opcode_ERROR);
  tp->th_code = htons((unsigned short)error);
  for(pe = errmsgs; pe->e_code >= 0; pe++)
    if(pe->e_code == error)
      break;
  if(pe->e_code < 0) {
    pe->e_msg = strerror(error - 100);
    tp->th_code = EUNDEF;   /* set 'undef' errorcode */
  }
  length = (int)strlen(pe->e_msg);

  /* we use memcpy() instead of strcpy() in order to avoid buffer overflow
   * report from glibc with FORTIFY_SOURCE */
  memcpy(tp->th_msg, pe->e_msg, length + 1);
  length += 5;
  if(swrite(peer, &buf.storage[0], length) != length)
    logmsg("nak: fail\n");
}